

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O3

int __thiscall
CVmObjStringBuffer::getp_substr
          (CVmObjStringBuffer *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  int32_t iVar2;
  int32_t len;
  bool bVar3;
  
  if (oargc == (uint *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = 1 < *oargc;
  }
  if (getp_substr(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_substr();
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,oargc,&getp_substr::desc);
  if (iVar1 == 0) {
    iVar2 = CVmBif::pop_long_val();
    len = *(int32_t *)(this->super_CVmObject).ext_;
    iVar1 = -1;
    if (iVar2 < 0) {
      iVar1 = len;
    }
    if (bVar3) {
      len = CVmBif::pop_long_val();
    }
    substr_to_string(this,retval,iVar1 + iVar2,len);
  }
  return 1;
}

Assistant:

int CVmObjStringBuffer::getp_substr(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *oargc)
{
    /* remember the argument count */
    uint argc = (oargc != 0 ? *oargc : 0);
    
    /* check arguments */
    static CVmNativeCodeDesc desc(1, 2);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* retrieve the starting index, and adjust for 0-based or end-based */
    int32_t idx = CVmBif::pop_long_val(vmg0_);
    idx += (idx < 0 ? get_ext()->len : -1);

    /* if there's a length, pop it; otherwise use the rest of the string */
    int32_t len = get_ext()->len;
    if (argc >= 2)
        len = CVmBif::pop_long_val(vmg0_);

    /* retrieve the substring */
    substr_to_string(vmg_ retval, idx, len);

    /* handled */
    return TRUE;
}